

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Cast_x86_avx512::forward(Cast_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  uint _c;
  int iVar2;
  int _elempack;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  unsigned_short uVar9;
  ulong uVar10;
  void *pvVar11;
  size_t sVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  void *pvVar15;
  undefined1 (*pauVar16) [64];
  int iVar17;
  ulong uVar18;
  int i;
  undefined1 auVar26 [16];
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [64];
  undefined1 (*pauVar22) [32];
  uint uVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar30;
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  
  iVar25 = (this->super_Cast).type_from;
  iVar24 = (this->super_Cast).type_to;
  if (iVar25 == iVar24) {
    iVar25 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar24 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar24;
      top_blob->h = iVar17;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar17 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _d = bottom_blob->d;
    _c = bottom_blob->c;
    iVar2 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar12 = (size_t)_elempack;
    switch(iVar24) {
    case 1:
      if (iVar25 == 3) {
        Cast::forward(&this->super_Cast,bottom_blob,top_blob,opt);
      }
      sVar12 = sVar12 * 4;
      break;
    case 2:
    case 4:
      sVar12 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar12 = bottom_blob->elemsize;
    }
    switch(iVar2) {
    case 1:
      Mat::create(top_blob,iVar17,sVar12,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar17,iVar1,sVar12,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar17,iVar1,_c,sVar12,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar17,iVar1,_d,_c,sVar12,_elempack,opt->blob_allocator);
    }
    iVar25 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar25 = (this->super_Cast).type_from;
      iVar24 = (this->super_Cast).type_to;
      if (iVar24 == 2 && iVar25 == 1) {
        iVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar23 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar23 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar23; uVar10 = uVar10 + 1) {
          pauVar21 = (undefined1 (*) [64])
                     (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar13 = (undefined1 (*) [16])
                     (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
          for (iVar24 = 0; iVar24 + 0xf < iVar25; iVar24 = iVar24 + 0x10) {
            auVar28 = vmovdqu64_avx512f(*pauVar21);
            auVar26 = vcvtps2ph_avx512vl(auVar28._0_16_,0);
            *(long *)*pauVar13 = auVar26._0_8_;
            *(undefined8 *)(*pauVar13 + 8) = 0;
            *(undefined8 *)pauVar13[1] = 0;
            *(undefined8 *)(pauVar13[1] + 8) = 0;
            pauVar21 = pauVar21 + 1;
            pauVar13 = pauVar13 + 2;
          }
          for (; iVar24 + 7 < iVar25; iVar24 = iVar24 + 8) {
            auVar26 = vcvtps2ph_f16c(*(undefined1 (*) [32])*pauVar21,8);
            *pauVar13 = auVar26;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
            pauVar13 = pauVar13 + 1;
          }
          for (; iVar24 + 3 < iVar25; iVar24 = iVar24 + 4) {
            vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar21,8);
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
            pauVar13 = (undefined1 (*) [16])(*pauVar13 + 8);
          }
          lVar14 = 0;
          for (; iVar24 < iVar25; iVar24 = iVar24 + 1) {
            uVar9 = float32_to_float16(*(float *)(*pauVar21 + lVar14 * 2));
            *(unsigned_short *)(*pauVar13 + lVar14) = uVar9;
            lVar14 = lVar14 + 2;
          }
        }
        iVar25 = (this->super_Cast).type_from;
        iVar24 = (this->super_Cast).type_to;
      }
      if (iVar24 == 1 && iVar25 == 2) {
        iVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        uVar23 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar23 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar23; uVar10 = uVar10 + 1) {
          pauVar22 = (undefined1 (*) [32])
                     (bottom_blob->cstep * uVar10 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar21 = (undefined1 (*) [64])
                     (top_blob->cstep * uVar10 * top_blob->elemsize + (long)top_blob->data);
          for (iVar24 = 0; iVar24 + 0xf < iVar25; iVar24 = iVar24 + 0x10) {
            auVar28 = vcvtph2ps_avx512f(*pauVar22);
            *pauVar21 = auVar28;
            pauVar22 = pauVar22 + 1;
            pauVar21 = pauVar21 + 1;
          }
          for (; iVar24 + 7 < iVar25; iVar24 = iVar24 + 8) {
            auVar27 = vcvtph2ps_f16c(*(undefined1 (*) [16])*pauVar22);
            *(undefined1 (*) [32])*pauVar21 = auVar27;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
            pauVar21 = (undefined1 (*) [64])((long)*pauVar21 + 0x20);
          }
          for (; iVar24 + 3 < iVar25; iVar24 = iVar24 + 4) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)*pauVar22;
            auVar26 = vcvtph2ps_f16c(auVar26);
            *(undefined1 (*) [16])*pauVar21 = auVar26;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + 8);
            pauVar21 = (undefined1 (*) [64])((long)*pauVar21 + 0x10);
          }
          lVar14 = 0;
          for (; iVar24 < iVar25; iVar24 = iVar24 + 1) {
            fVar30 = float16_to_float32(*(unsigned_short *)(*pauVar22 + lVar14));
            *(float *)((long)*pauVar21 + lVar14 * 2) = fVar30;
            lVar14 = lVar14 + 2;
          }
        }
        iVar25 = (this->super_Cast).type_from;
        iVar24 = (this->super_Cast).type_to;
      }
      if ((iVar25 == 3) && (iVar24 == 1)) {
        uVar23 = _d * _elempack * iVar1 * iVar17;
        pvVar11 = bottom_blob->data;
        sVar12 = bottom_blob->cstep;
        pvVar15 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar18 = 0;
        uVar10 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar10 = uVar18;
        }
        uVar20 = (ulong)_c;
        if ((int)_c < 1) {
          uVar20 = uVar18;
        }
        sVar6 = bottom_blob->elemsize;
        for (; uVar18 != uVar20; uVar18 = uVar18 + 1) {
          for (uVar19 = 0; uVar10 != uVar19; uVar19 = uVar19 + 1) {
            *(float *)((long)pvVar15 + uVar19 * 4) = (float)(int)*(char *)((long)pvVar11 + uVar19);
          }
          pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar5);
          pvVar11 = (void *)((long)pvVar11 + sVar12 * sVar6);
        }
        iVar24 = (this->super_Cast).type_to;
      }
      if ((iVar25 == 1) && (iVar24 == 4)) {
        iVar25 = cpu_support_x86_avx512_bf16();
        if (iVar25 == 0) {
          iVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          uVar18 = 0;
          uVar10 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar10 = uVar18;
          }
          auVar28 = vpmovsxbw_avx512bw(_DAT_00543d79);
          for (; uVar18 != uVar10; uVar18 = uVar18 + 1) {
            pauVar21 = (undefined1 (*) [64])
                       (bottom_blob->cstep * uVar18 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
            pauVar16 = (undefined1 (*) [64])
                       (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
            for (iVar24 = 0; iVar24 + 0x1f < iVar25; iVar24 = iVar24 + 0x20) {
              auVar29 = vmovdqu64_avx512f(*pauVar21);
              auVar29 = vpermt2w_avx512bw(auVar29,auVar28,pauVar21[1]);
              auVar29 = vmovdqu64_avx512f(auVar29);
              *pauVar16 = auVar29;
              pauVar21 = pauVar21 + 2;
              pauVar16 = pauVar16 + 1;
            }
            for (; iVar24 + 0xf < iVar25; iVar24 = iVar24 + 0x10) {
              auVar29 = vpsrld_avx512f(*pauVar21,0x10);
              auVar27 = vpmovdw_avx512f(auVar29);
              *(undefined1 (*) [32])*pauVar16 = auVar27;
              pauVar21 = pauVar21 + 1;
              pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x20);
            }
            for (; iVar24 + 7 < iVar25; iVar24 = iVar24 + 8) {
              auVar27 = vpsrld_avx512vl(*(undefined1 (*) [32])*pauVar21,0x10);
              auVar26 = vpackusdw_avx(auVar27._0_16_,auVar27._16_16_);
              *(undefined1 (*) [16])*pauVar16 = auVar26;
              pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
              pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x10);
            }
            lVar14 = 0;
            for (; iVar24 < iVar25; iVar24 = iVar24 + 1) {
              *(undefined2 *)(*pauVar16 + lVar14 * 2) = *(undefined2 *)(*pauVar21 + lVar14 * 4 + 2);
              lVar14 = lVar14 + 1;
            }
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
      iVar25 = 0;
      if (((this->super_Cast).type_from == 4) && ((this->super_Cast).type_to == 1)) {
        uVar32 = 0;
        uVar33 = 0;
        uVar34 = 0;
        uVar35 = 0;
        iVar24 = cpu_support_x86_avx512_bf16();
        if (iVar24 == 0) {
          iVar24 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
          iVar25 = 0;
          uVar10 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar10 = 0;
          }
          for (uVar18 = 0; uVar18 != uVar10; uVar18 = uVar18 + 1) {
            pauVar22 = (undefined1 (*) [32])
                       (bottom_blob->cstep * uVar18 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
            pauVar21 = (undefined1 (*) [64])
                       (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
            for (iVar17 = 0; iVar17 + 0xf < iVar24; iVar17 = iVar17 + 0x10) {
              auVar7 = vpunpcklwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar22);
              auVar27 = vpunpckhwd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*pauVar22);
              auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar27._0_16_;
              auVar8 = vperm2i128_avx2(auVar7,auVar27,0x31);
              auVar28._16_8_ = auVar26._0_8_;
              auVar28._0_16_ = ZEXT116(0) * auVar27._0_16_ + ZEXT116(1) * auVar7._0_16_;
              auVar28._24_8_ = auVar26._8_8_;
              auVar28._32_8_ = uVar32;
              auVar28._40_8_ = uVar33;
              auVar28._48_8_ = uVar34;
              auVar28._56_8_ = uVar35;
              auVar28 = vinserti64x4_avx512f(auVar28,auVar8,1);
              auVar28 = vmovdqu64_avx512f(auVar28);
              *pauVar21 = auVar28;
              pauVar22 = pauVar22 + 1;
              pauVar21 = pauVar21 + 1;
            }
            for (; iVar17 + 7 < iVar24; iVar17 = iVar17 + 8) {
              auVar31 = vpunpcklwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar22);
              auVar26 = vpunpckhwd_avx((undefined1  [16])0x0,*(undefined1 (*) [16])*pauVar22);
              *(undefined1 (*) [16])(*pauVar21 + 0x10) = auVar26;
              *(undefined1 (*) [16])*pauVar21 = auVar31;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
              pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x20);
            }
            for (; iVar17 + 3 < iVar24; iVar17 = iVar17 + 4) {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)*pauVar22;
              auVar26 = vpunpcklwd_avx((undefined1  [16])0x0,auVar31);
              *(undefined1 (*) [16])*pauVar21 = auVar26;
              pauVar22 = (undefined1 (*) [32])(*pauVar22 + 8);
              pauVar21 = (undefined1 (*) [64])(*pauVar21 + 0x10);
            }
            lVar14 = 0;
            for (; iVar17 < iVar24; iVar17 = iVar17 + 1) {
              *(uint *)(*pauVar21 + lVar14 * 2) = (uint)*(ushort *)(*pauVar22 + lVar14) << 0x10;
              lVar14 = lVar14 + 2;
            }
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx512bf16(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar25;
}

Assistant:

int Cast_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}